

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Brainfck.cpp
# Opt level: O2

void __thiscall
implementations::brainfck::BFImplementation::BFImplementation(BFImplementation *this,env_p *_env)

{
  __shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  std::__shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_30,
               &_env->
                super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>
              );
  stackless::
  Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>::
  Implementation(&this->
                  super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
                 ,(env_p *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  (this->
  super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
  )._vptr_Implementation = (_func_int **)&PTR_getCurrentFrame_00130980;
  std::__shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_40,
               &_env->
                super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>
              );
  BFFrame::BFFrame(&this->frame,(env_p *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return;
}

Assistant:

BFImplementation(env_p _env) : Implementation(_env), frame(BFFrame(_env)) {
	}